

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackDebGenerator.cxx
# Opt level: O0

int __thiscall
cmCPackDebGenerator::PackageComponentsAllInOne(cmCPackDebGenerator *this,string *compInstDirName)

{
  cmCPackLog *pcVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  ostream *poVar5;
  undefined4 extraout_var;
  ulong uVar6;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  allocator<char> local_7f1;
  string local_7f0;
  allocator<char> local_7c9;
  string local_7c8;
  int local_7a4;
  string local_7a0 [4];
  int res;
  undefined1 local_780 [8];
  ostringstream cmCPackLog_msg_2;
  allocator<char> local_602;
  allocator<char> local_601;
  string local_600;
  undefined1 local_5e0 [8];
  string findExpr;
  Glob gl;
  string local_560 [32];
  undefined1 local_540 [8];
  ostringstream cmCPackLog_msg_1;
  allocator<char> local_3c1;
  string local_3c0;
  allocator<char> local_399;
  string local_398 [8];
  string component_path;
  string local_370;
  allocator<char> local_349;
  string local_348;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  allocator<char> local_301;
  string local_300;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  allocator<char> local_2ba;
  allocator<char> local_2b9;
  string local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  undefined1 local_278 [8];
  string outputFileName;
  string packageFileName;
  string localToplevel;
  undefined1 local_1f8 [8];
  ostringstream cmCPackLog_msg;
  allocator<char> local_7d [20];
  allocator<char> local_69;
  string local_68;
  string local_48 [8];
  string initialTopLevel;
  int retval;
  string *compInstDirName_local;
  cmCPackDebGenerator *this_local;
  
  initialTopLevel.field_2._12_4_ = 1;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&(this->super_cmCPackGenerator).packageFileNames);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"CPACK_TEMPORARY_DIRECTORY",&local_69);
  pcVar4 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_48,pcVar4,local_7d);
  std::allocator<char>::~allocator(local_7d);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f8);
  poVar5 = std::operator<<((ostream *)local_1f8,
                           "Packaging all groups in one package...(CPACK_COMPONENTS_ALL_[GROUPS_]IN_ONE_PACKAGE is set)"
                          );
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  pcVar1 = (this->super_cmCPackGenerator).Logger;
  std::__cxx11::ostringstream::str();
  pcVar4 = (char *)std::__cxx11::string::c_str();
  cmCPackLog::Log(pcVar1,2,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cmCPackDebGenerator.cxx"
                  ,0x24e,pcVar4);
  std::__cxx11::string::~string((string *)(localToplevel.field_2._M_local_buf + 8));
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1f8);
  std::__cxx11::string::string((string *)(packageFileName.field_2._M_local_buf + 8),local_48);
  cmsys::SystemTools::GetParentDirectory
            ((string *)((long)&outputFileName.field_2 + 8),&(this->super_cmCPackGenerator).toplevel)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2b8,"CPACK_PACKAGE_FILE_NAME",&local_2b9);
  pcVar4 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_2b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_298,pcVar4,&local_2ba);
  iVar3 = (*(this->super_cmCPackGenerator)._vptr_cmCPackGenerator[4])();
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_278,
                 &local_298,(char *)CONCAT44(extraout_var,iVar3));
  std::__cxx11::string::~string((string *)&local_298);
  std::allocator<char>::~allocator(&local_2ba);
  std::__cxx11::string::~string((string *)&local_2b8);
  std::allocator<char>::~allocator(&local_2b9);
  uVar6 = std::__cxx11::string::empty();
  if ((uVar6 & 1) == 0) {
    std::operator+(&local_2e0,"/",compInstDirName);
    std::__cxx11::string::operator+=
              ((string *)(packageFileName.field_2._M_local_buf + 8),(string *)&local_2e0);
    std::__cxx11::string::~string((string *)&local_2e0);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_300,"CPACK_TEMPORARY_DIRECTORY",&local_301);
  pcVar4 = (char *)std::__cxx11::string::c_str();
  cmCPackGenerator::SetOption(&this->super_cmCPackGenerator,&local_300,pcVar4);
  std::__cxx11::string::~string((string *)&local_300);
  std::allocator<char>::~allocator(&local_301);
  std::operator+(&local_328,"/",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_278);
  std::__cxx11::string::operator+=
            ((string *)(outputFileName.field_2._M_local_buf + 8),(string *)&local_328);
  std::__cxx11::string::~string((string *)&local_328);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_348,"CPACK_OUTPUT_FILE_NAME",&local_349);
  pcVar4 = (char *)std::__cxx11::string::c_str();
  cmCPackGenerator::SetOption(&this->super_cmCPackGenerator,&local_348,pcVar4);
  std::__cxx11::string::~string((string *)&local_348);
  std::allocator<char>::~allocator(&local_349);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_370,"CPACK_TEMPORARY_PACKAGE_FILE_NAME",
             (allocator<char> *)(component_path.field_2._M_local_buf + 0xf));
  pcVar4 = (char *)std::__cxx11::string::c_str();
  cmCPackGenerator::SetOption(&this->super_cmCPackGenerator,&local_370,pcVar4);
  std::__cxx11::string::~string((string *)&local_370);
  std::allocator<char>::~allocator((allocator<char> *)(component_path.field_2._M_local_buf + 0xf));
  uVar6 = std::__cxx11::string::empty();
  if ((uVar6 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_398,"/",&local_399);
    std::allocator<char>::~allocator(&local_399);
    std::__cxx11::string::operator+=(local_398,(string *)compInstDirName);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3c0,"CPACK_DEB_PACKAGE_COMPONENT_PART_PATH",&local_3c1);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    cmCPackGenerator::SetOption(&this->super_cmCPackGenerator,&local_3c0,pcVar4);
    std::__cxx11::string::~string((string *)&local_3c0);
    std::allocator<char>::~allocator(&local_3c1);
    std::__cxx11::string::~string(local_398);
  }
  bVar2 = cmCPackGenerator::ReadListFile
                    (&this->super_cmCPackGenerator,"Internal/CPack/CPackDeb.cmake");
  if (bVar2) {
    cmsys::Glob::Glob((Glob *)((long)&findExpr.field_2 + 8));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_600,"GEN_WDIR",&local_601);
    pcVar4 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_600);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_5e0,pcVar4,&local_602);
    std::allocator<char>::~allocator(&local_602);
    std::__cxx11::string::~string((string *)&local_600);
    std::allocator<char>::~allocator(&local_601);
    std::__cxx11::string::operator+=((string *)local_5e0,"/*");
    cmsys::Glob::RecurseOn((Glob *)((long)&findExpr.field_2 + 8));
    cmsys::Glob::SetRecurseListDirs((Glob *)((long)&findExpr.field_2 + 8),true);
    bVar2 = cmsys::Glob::FindFiles
                      ((Glob *)((long)&findExpr.field_2 + 8),(string *)local_5e0,(GlobMessages *)0x0
                      );
    if (bVar2) {
      __x = cmsys::Glob::GetFiles_abi_cxx11_((Glob *)((long)&findExpr.field_2 + 8));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=(&this->packageFiles,__x);
      local_7a4 = createDeb(this);
      if (local_7a4 != 1) {
        initialTopLevel.field_2._12_4_ = 0;
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_7c8,"CPACK_TOPLEVEL_DIRECTORY",&local_7c9);
      pcVar4 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_7c8);
      std::__cxx11::string::operator=((string *)(outputFileName.field_2._M_local_buf + 8),pcVar4);
      std::__cxx11::string::~string((string *)&local_7c8);
      std::allocator<char>::~allocator(&local_7c9);
      std::__cxx11::string::operator+=((string *)(outputFileName.field_2._M_local_buf + 8),"/");
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_7f0,"GEN_CPACK_OUTPUT_FILE_NAME",&local_7f1);
      pcVar4 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_7f0);
      std::__cxx11::string::operator+=((string *)(outputFileName.field_2._M_local_buf + 8),pcVar4);
      std::__cxx11::string::~string((string *)&local_7f0);
      std::allocator<char>::~allocator(&local_7f1);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&(this->super_cmCPackGenerator).packageFileNames,
                  (value_type *)((long)&outputFileName.field_2 + 8));
      this_local._4_4_ = initialTopLevel.field_2._12_4_;
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_780);
      poVar5 = std::operator<<((ostream *)local_780,
                               "Cannot find any files in the installed directory");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      pcVar1 = (this->super_cmCPackGenerator).Logger;
      std::__cxx11::ostringstream::str();
      pcVar4 = (char *)std::__cxx11::string::c_str();
      cmCPackLog::Log(pcVar1,0x10,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cmCPackDebGenerator.cxx"
                      ,0x27c,pcVar4);
      std::__cxx11::string::~string(local_7a0);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_780);
      this_local._4_4_ = 0;
    }
    std::__cxx11::string::~string((string *)local_5e0);
    cmsys::Glob::~Glob((Glob *)((long)&findExpr.field_2 + 8));
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_540);
    poVar5 = std::operator<<((ostream *)local_540,"Error while execution CPackDeb.cmake");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    pcVar1 = (this->super_cmCPackGenerator).Logger;
    std::__cxx11::ostringstream::str();
    pcVar4 = (char *)std::__cxx11::string::c_str();
    cmCPackLog::Log(pcVar1,0x10,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cmCPackDebGenerator.cxx"
                    ,0x26f,pcVar4);
    std::__cxx11::string::~string(local_560);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_540);
    initialTopLevel.field_2._12_4_ = 0;
    this_local._4_4_ = 0;
  }
  std::__cxx11::string::~string((string *)local_278);
  std::__cxx11::string::~string((string *)(outputFileName.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(packageFileName.field_2._M_local_buf + 8));
  std::__cxx11::string::~string(local_48);
  return this_local._4_4_;
}

Assistant:

int cmCPackDebGenerator::PackageComponentsAllInOne(
  const std::string& compInstDirName)
{
  int retval = 1;
  /* Reset package file name list it will be populated during the
   * component packaging run*/
  packageFileNames.clear();
  std::string initialTopLevel(this->GetOption("CPACK_TEMPORARY_DIRECTORY"));

  cmCPackLogger(cmCPackLog::LOG_VERBOSE,
                "Packaging all groups in one package..."
                "(CPACK_COMPONENTS_ALL_[GROUPS_]IN_ONE_PACKAGE is set)"
                  << std::endl);

  // The ALL GROUPS in ONE package case
  std::string localToplevel(initialTopLevel);
  std::string packageFileName(cmSystemTools::GetParentDirectory(toplevel));
  std::string outputFileName(
    std::string(this->GetOption("CPACK_PACKAGE_FILE_NAME")) +
    this->GetOutputExtension());
  // all GROUP in one vs all COMPONENT in one
  // if must be here otherwise non component paths have a trailing / while
  // components don't
  if (!compInstDirName.empty()) {
    localToplevel += "/" + compInstDirName;
  }

  /* replace the TEMP DIRECTORY with the component one */
  this->SetOption("CPACK_TEMPORARY_DIRECTORY", localToplevel.c_str());
  packageFileName += "/" + outputFileName;
  /* replace proposed CPACK_OUTPUT_FILE_NAME */
  this->SetOption("CPACK_OUTPUT_FILE_NAME", outputFileName.c_str());
  /* replace the TEMPORARY package file name */
  this->SetOption("CPACK_TEMPORARY_PACKAGE_FILE_NAME",
                  packageFileName.c_str());

  if (!compInstDirName.empty()) {
    // Tell CPackDeb.cmake the path where the component is.
    std::string component_path = "/";
    component_path += compInstDirName;
    this->SetOption("CPACK_DEB_PACKAGE_COMPONENT_PART_PATH",
                    component_path.c_str());
  }
  if (!this->ReadListFile("Internal/CPack/CPackDeb.cmake")) {
    cmCPackLogger(cmCPackLog::LOG_ERROR,
                  "Error while execution CPackDeb.cmake" << std::endl);
    retval = 0;
    return retval;
  }

  cmsys::Glob gl;
  std::string findExpr(this->GetOption("GEN_WDIR"));
  findExpr += "/*";
  gl.RecurseOn();
  gl.SetRecurseListDirs(true);
  if (!gl.FindFiles(findExpr)) {
    cmCPackLogger(cmCPackLog::LOG_ERROR,
                  "Cannot find any files in the installed directory"
                    << std::endl);
    return 0;
  }
  packageFiles = gl.GetFiles();

  int res = createDeb();
  if (res != 1) {
    retval = 0;
  }
  // add the generated package to package file names list
  packageFileName = this->GetOption("CPACK_TOPLEVEL_DIRECTORY");
  packageFileName += "/";
  packageFileName += this->GetOption("GEN_CPACK_OUTPUT_FILE_NAME");
  packageFileNames.push_back(std::move(packageFileName));
  return retval;
}